

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_lua_struct_definition
          (t_lua_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar4;
  reference pptVar5;
  string *psVar6;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_78;
  t_field **local_70;
  string local_58;
  members_type *local_38;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  const_iterator m_iter;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  m_iter._M_current._7_1_ = is_exception;
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)&members);
  local_38 = t_struct::get_members(tstruct);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  if ((m_iter._M_current._7_1_ & 1) == 0) {
    poVar3 = std::operator<<(out," = __TObject:new{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = std::operator<<(out," = TException:new{");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    poVar3 = std::operator<<(poVar3,"  __type = \'");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar3,"\'");
    std::__cxx11::string::~string((string *)&local_58);
    sVar4 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(local_38);
    if (sVar4 != 0) {
      std::operator<<(out,",");
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_up((t_generator *)this);
  local_70 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(local_38);
  members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_70;
  while( true ) {
    local_78._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(local_38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&members,&local_78);
    if (!bVar1) break;
    t_generator::indent((t_generator *)this,out);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&members);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::operator<<(out,(string *)psVar6);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)&members);
    local_80._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(local_38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&members,&local_80);
    if (bVar1) {
      poVar3 = std::operator<<(out,",");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  t_generator::indent_down((t_generator *)this);
  t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,"}");
  generate_lua_struct_reader(this,out,tstruct);
  generate_lua_struct_writer(this,out,tstruct);
  return;
}

Assistant:

void t_lua_generator::generate_lua_struct_definition(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_exception) {
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  indent(out) << endl << endl << tstruct->get_name();
  if (is_exception) {
    out << " = TException:new{" << endl << indent() << "  __type = '" << tstruct->get_name() << "'";
    if (members.size() > 0) {
      out << ",";
    }
    out << endl;
  } else {
    out << " = __TObject:new{" << endl;
  }
  indent_up();
  for (m_iter = members.begin(); m_iter != members.end();) {
    indent(out);
    out << (*m_iter)->get_name();
    ++m_iter;
    if (m_iter != members.end()) {
      out << "," << endl;
    }
  }
  indent_down();
  indent(out);
  out << endl << "}";

  generate_lua_struct_reader(out, tstruct);
  generate_lua_struct_writer(out, tstruct);
}